

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphamapblit_argb32_oneline
               (uchar *map,int mapWidth,QRgba64 *srcColor,quint32 *dest,quint32 c,
               QColorTrcLut *colorProfile)

{
  long lVar1;
  int in_ESI;
  QRgba64 in_RDI;
  quint32 *in_R9;
  long in_FS_OFFSET;
  int i;
  quint32 in_stack_ffffffffffffffb8;
  int coverage;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (coverage = 0; coverage < in_ESI; coverage = coverage + 1) {
    alphamapblend_argb32(in_R9,coverage,in_RDI,in_stack_ffffffffffffffb8,(QColorTrcLut *)0xb77f20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_alphamapblit_argb32_oneline(const uchar *map,
                                           int mapWidth, const QRgba64 &srcColor,
                                           quint32 *dest, const quint32 c,
                                           const QColorTrcLut *colorProfile)
{
    for (int i = 0; i < mapWidth; ++i)
        alphamapblend_argb32(dest + i, map[i], srcColor, c, colorProfile);
}